

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

ALCenum alcGetEnumValue(ALCdevice *_device,ALCchar *enumname)

{
  uint32 x;
  DeviceWrapper *device;
  
  device = &null_device;
  if (_device != (ALCdevice *)0x0) {
    device = (DeviceWrapper *)_device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alcGetEnumValue);
  IO_UINT64((uint64)_device);
  IO_STRING(enumname);
  x = (*REAL_alcGetEnumValue)(device->device,enumname);
  writele32(x);
  check_alc_error_events(device);
  check_al_async_states();
  APIUNLOCK();
  return x;
}

Assistant:

ALCenum alcGetEnumValue(ALCdevice *_device, const ALCchar *enumname)
{
    DeviceWrapper *device = _device ? (DeviceWrapper *) _device : &null_device;
    ALCenum retval;
    IO_START(alcGetEnumValue);
    IO_PTR(_device);
    IO_STRING(enumname);
    retval = REAL_alcGetEnumValue(device->device, enumname);
    IO_ALCENUM(retval);
    IO_END_ALC(device);
    return retval;
}